

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int32_t floor_log2(int64_t x)

{
  int32_t y;
  int64_t x_local;
  
  y = 0;
  for (x_local = x; 1 < x_local; x_local = x_local >> 1) {
    y = y + 1;
  }
  return y;
}

Assistant:

static int32_t
floor_log2 (int64_t x)
{
    int32_t y = 0;
    while (x > 1)
    {
        y += 1;
        x >>= 1;
    }
    return y;
}